

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChParserOpenSim::initShapes
          (ChParserOpenSim *this,xml_node<char> *node,ChSystem *system)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  char *pcVar14;
  element_type *peVar15;
  undefined1 auVar16 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *radius;
  pointer pcVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  undefined8 uVar19;
  undefined8 uVar20;
  bool bVar21;
  char cVar22;
  int iVar23;
  ChBodyAuxRef *pCVar24;
  ChBodyAuxRef *this_00;
  iterator iVar25;
  mapped_type *pmVar26;
  mapped_type *pmVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar29;
  long *plVar30;
  ChSphereShape *this_01;
  ChCylinderShape *this_02;
  _Rb_tree_node_base *p_Var31;
  pointer pcVar32;
  pointer psVar33;
  _Sp_alloc_shared_tag<std::allocator<chrono::ChVisualMaterial>_> size;
  shared_ptr<chrono::ChVisualShape> *shape;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  double dVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  double dVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  double dVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  double dVar129;
  undefined1 auVar130 [16];
  double dVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double m10;
  double m20;
  double m10_1;
  double m20_1;
  collision_cylinder_specs new_cyl;
  shared_ptr<chrono::ChVisualMaterial> vis_mat;
  body_collision_struct body_info;
  shared_ptr<chrono::ChSphereShape> sphere;
  shared_ptr<chrono::ChCylinderShape> cylinder;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
  body_info_pair;
  ChCoordsys<double> linkCoords;
  double local_360;
  double local_358;
  double local_348;
  undefined8 uStack_340;
  double local_338;
  undefined8 uStack_330;
  double local_320;
  undefined1 local_2f8 [16];
  double local_2e0;
  undefined1 local_2d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  double dStack_2b8;
  undefined1 auStack_2b0 [104];
  double local_248;
  double local_240;
  _Rb_tree_node_base *local_238;
  allocator local_229;
  ChVisualMaterial *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  ChBodyAuxRef *local_218;
  vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
  local_210;
  ulong local_1f8;
  int local_1f0;
  ChSphereShape *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  undefined1 local_1d8 [16];
  ChQuaternion<double> local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
  local_1a0;
  shared_ptr<chrono::ChMaterialSurface> local_150;
  shared_ptr<chrono::ChVisualShape> local_140;
  shared_ptr<chrono::ChVisualMaterial> local_130;
  shared_ptr<chrono::ChVisualShape> local_120;
  shared_ptr<chrono::ChVisualMaterial> local_110;
  double local_100;
  ChSystem *local_f8;
  pointer local_f0;
  ChFrame<double> local_e8;
  key_type local_60;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  long lVar28;
  
  local_f8 = system;
  if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Creating collision and visualization shapes ",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  psVar33 = (this->m_jointList).
            super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (this->m_jointList).
             super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar33 == local_f0) {
    fVar42 = 0.0;
  }
  else {
    local_238 = (_Rb_tree_node_base *)0x0;
    do {
      peVar12 = (psVar33->super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var13 = (psVar33->super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        }
      }
      (*(peVar12->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3f])
                (&local_e8,peVar12);
      if (peVar12->Body1 == (ChBodyFrame *)0x0) {
        pCVar24 = (ChBodyAuxRef *)0x0;
      }
      else {
        pCVar24 = (ChBodyAuxRef *)
                  __dynamic_cast(peVar12->Body1,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78)
        ;
      }
      if (peVar12->Body2 == (ChBodyFrame *)0x0) {
        this_00 = (ChBodyAuxRef *)0x0;
      }
      else {
        this_00 = (ChBodyAuxRef *)
                  __dynamic_cast(peVar12->Body2,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78)
        ;
      }
      std::__cxx11::string::string
                ((string *)local_2d8,
                 (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1a0);
      iVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                       *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if (iVar25._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
        pmVar26->body = pCVar24;
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::string
                ((string *)local_2d8,
                 (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1a0);
      iVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                       *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if (iVar25._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
        pmVar26->body = this_00;
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::string
                ((string *)local_2d8,
                 (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1a0);
      pmVar26 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      std::__cxx11::string::string
                ((string *)local_2d8,
                 (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1a0);
      pmVar27 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      bVar21 = ChBody::GetBodyFixed(&pCVar24->super_ChBody);
      if (bVar21) {
        pmVar26->level = 0;
      }
      uVar1 = pmVar26->level + 1;
      iVar23 = (int)local_238;
      local_238 = (_Rb_tree_node_base *)((ulong)local_238 & 0xffffffff);
      if (iVar23 <= pmVar26->level) {
        local_238 = (_Rb_tree_node_base *)(ulong)uVar1;
      }
      pmVar27->level = uVar1;
      ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)local_2d8,pCVar24);
      uVar20 = local_2c8._8_8_;
      uVar19 = local_2c8._M_allocated_capacity;
      _Var18._M_pi = _Stack_2d0._M_pi;
      iVar23 = (*(pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(pCVar24)
      ;
      lVar28 = CONCAT44(extraout_var,iVar23);
      dVar46 = (double)local_e8._vptr_ChFrame - *(double *)(lVar28 + 8);
      dVar45 = local_e8.coord.pos.m_data[0] - *(double *)(lVar28 + 0x10);
      dVar129 = local_e8.coord.pos.m_data[1] - *(double *)(lVar28 + 0x18);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)(lVar28 + 0x40);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar46;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = dVar45 * *(double *)(lVar28 + 0x58);
      auVar38 = vfmadd231sd_fma(auVar99,auVar47,auVar38);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar28 + 0x70);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = dVar129;
      auVar38 = vfmadd231sd_fma(auVar38,auVar78,auVar40);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(lVar28 + 0x48);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = dVar45 * *(double *)(lVar28 + 0x60);
      auVar40 = vfmadd231sd_fma(auVar114,auVar47,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(lVar28 + 0x78);
      auVar40 = vfmadd231sd_fma(auVar40,auVar78,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(lVar28 + 0x50);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar46;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = dVar45 * *(double *)(lVar28 + 0x68);
      auVar2 = vfmadd231sd_fma(auVar117,auVar48,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(lVar28 + 0x80);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = dVar129;
      auVar2 = vfmadd231sd_fma(auVar2,auVar79,auVar5);
      dVar46 = auVar38._0_8_ - (double)_Var18._M_pi;
      dVar44 = auVar40._0_8_;
      dVar45 = dVar44 - (double)uVar19;
      dVar129 = auVar2._0_8_ - (double)uVar20;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar45 * dVar45;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar46;
      auVar40 = vfmadd231sd_fma(auVar49,auVar71,auVar71);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar129;
      auVar40 = vfmadd231sd_fma(auVar40,auVar88,auVar88);
      if (auVar40._0_8_ < 0.0) {
        local_2f8._0_8_ = dVar44;
        dVar43 = sqrt(auVar40._0_8_);
      }
      else {
        auVar40 = vsqrtsd_avx(auVar40,auVar40);
        dVar43 = auVar40._0_8_;
      }
      if (1e-05 < dVar43) {
        local_240 = (double)_Var18._M_pi - auVar38._0_8_;
        local_248 = (double)uVar19 - dVar44;
        dVar44 = (double)uVar20 - auVar2._0_8_;
        auVar35 = ZEXT816(0) << 0x40;
        if (((local_240 != 0.0) || (NAN(local_240))) || (local_248 != 0.0)) {
LAB_00959d77:
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_248 * local_248;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = local_240;
          auVar38 = vfmadd231sd_fma(auVar50,auVar100,auVar100);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = dVar44;
          auVar38 = vfmadd231sd_fma(auVar38,auVar94,auVar94);
          if (auVar38._0_8_ < 0.0) {
            dVar43 = sqrt(auVar38._0_8_);
          }
          else {
            auVar38 = vsqrtsd_avx(auVar38,auVar38);
            dVar43 = auVar38._0_8_;
          }
          bVar21 = 2.2250738585072014e-308 <= dVar43;
          dVar43 = 1.0 / dVar43;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = (ulong)bVar21 * (long)(local_248 * dVar43);
          auVar126._8_8_ = 0;
          auVar126._0_8_ =
               (ulong)bVar21 * (long)(local_240 * dVar43) + (ulong)!bVar21 * 0x3ff0000000000000;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = (ulong)bVar21 * (long)(dVar44 * dVar43);
        }
        else {
          auVar34 = ZEXT816(0) << 0x40;
          auVar126 = ZEXT816(0x3ff0000000000000);
          if ((dVar44 != 0.0) || (NAN(dVar44))) goto LAB_00959d77;
        }
        auVar40 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar34,auVar35);
        dVar125 = auVar126._0_8_;
        dVar131 = dVar125 * -0.0;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = dVar131;
        auVar38 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar35,auVar122);
        dVar111 = auVar34._0_8_;
        dVar43 = dVar125 + dVar111 * -0.0;
        local_2e0 = auVar38._0_8_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_2e0 * local_2e0;
        auVar38 = vfmadd231sd_fma(auVar51,auVar40,auVar40);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = dVar43;
        auVar38 = vfmadd231sd_fma(auVar38,auVar118,auVar118);
        local_360 = auVar40._0_8_;
        local_2f8._0_8_ = dVar43;
        if (auVar38._0_8_ < 0.0) {
          local_1d8._0_8_ = dVar131;
          dVar43 = sqrt(auVar38._0_8_);
          dVar131 = (double)local_1d8._0_8_;
        }
        else {
          auVar38 = vsqrtsd_avx(auVar38,auVar38);
          dVar43 = auVar38._0_8_;
        }
        auVar101._8_8_ = 0;
        auVar101._0_8_ = local_240;
        dVar105 = auVar35._0_8_;
        if (dVar43 < 0.0001) {
          auVar80._8_8_ = 0;
          auVar80._0_8_ = dVar105 * -0.0;
          auVar38 = vfmadd231sd_fma(auVar80,auVar34,ZEXT816(0) << 0x40);
          local_2e0 = dVar131 + dVar105;
          auVar2 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar126,auVar34);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_2e0 * local_2e0;
          auVar40 = vfmadd231sd_fma(auVar52,auVar38,auVar38);
          auVar40 = vfmadd231sd_fma(auVar40,auVar2,auVar2);
          local_360 = auVar38._0_8_;
          local_2f8._0_8_ = auVar2._0_8_;
          if (auVar40._0_8_ < 0.0) {
            dVar43 = sqrt(auVar40._0_8_);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_240;
          }
          else {
            auVar38 = vsqrtsd_avx(auVar40,auVar40);
            dVar43 = auVar38._0_8_;
          }
        }
        auVar95._8_8_ = 0;
        auVar95._0_8_ = dVar44;
        auStack_2b0._8_8_ = 0.0;
        auStack_2b0._16_8_ = 0.0;
        auStack_2b0._24_8_ = 0.0;
        local_2c8._M_allocated_capacity = 0;
        local_2c8._8_8_ = 0;
        dStack_2b8 = 0.0;
        auStack_2b0._0_8_ = 0.0;
        local_2d8 = (undefined1  [8])0x3f947ae147ae147b;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_248 * local_248;
        auVar38 = vfmadd213sd_fma(auVar101,auVar101,auVar53);
        auVar38 = vfmadd213sd_fma(auVar95,auVar95,auVar38);
        if (auVar38._0_8_ < 0.0) {
          dVar44 = sqrt(auVar38._0_8_);
        }
        else {
          auVar38 = vsqrtsd_avx(auVar38,auVar38);
          dVar44 = auVar38._0_8_;
        }
        dVar43 = 1.0 / dVar43;
        dVar131 = local_360 * dVar43;
        local_2e0 = local_2e0 * dVar43;
        dVar43 = (double)local_2f8._0_8_ * dVar43;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = dVar111 * dVar43;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_2e0;
        auVar38 = vfmsub231sd_fma(auVar130,auVar132,auVar35);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = dVar43;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = dVar131 * dVar105;
        auVar40 = vfmsub231sd_fma(auVar81,auVar72,auVar126);
        auVar128._8_8_ = 0;
        auVar128._0_8_ = dVar131;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = dVar125 * local_2e0;
        auVar2 = vfmsub231sd_fma(auVar134,auVar128,auVar34);
        _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(dVar44 * 0.5);
        local_2c8._M_allocated_capacity = (size_type)(dVar46 * 0.5);
        local_2c8._8_8_ = dVar45 * 0.5;
        dStack_2b8 = dVar129 * 0.5;
        dVar45 = auVar40._0_8_;
        dVar46 = dVar43 + dVar125 + dVar45;
        dVar129 = auVar38._0_8_;
        dVar44 = auVar2._0_8_;
        uStack_340 = auVar34._8_8_;
        uStack_330 = auVar35._8_8_;
        if (0.0 <= dVar46) {
          dVar46 = dVar46 + 1.0;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar46;
          if (dVar46 < 0.0) {
            local_360 = sqrt(dVar46);
          }
          else {
            auVar38 = vsqrtsd_avx(auVar54,auVar54);
            local_360 = auVar38._0_8_;
          }
          local_358 = local_360 * 0.5;
          local_360 = 0.5 / local_360;
          local_338 = (dVar44 - local_2e0) * local_360;
          local_348 = (dVar131 - dVar105) * local_360;
          local_360 = (dVar111 - dVar129) * local_360;
        }
        else {
          cVar22 = dVar125 < dVar45;
          dVar46 = dVar125;
          if ((bool)cVar22) {
            dVar46 = dVar45;
          }
          if (dVar46 < dVar43) {
            cVar22 = '\x02';
          }
          if (cVar22 == '\x02') {
            dVar46 = ((dVar43 - dVar125) - dVar45) + 1.0;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              local_358 = sqrt(dVar46);
            }
            else {
              auVar38 = vsqrtsd_avx(auVar56,auVar56);
              local_358 = auVar38._0_8_;
            }
            local_360 = local_358 * 0.5;
            local_358 = 0.5 / local_358;
            local_338 = (dVar131 + dVar105) * local_358;
            local_348 = (local_2e0 + dVar44) * local_358;
            dVar131 = dVar111 - dVar129;
          }
          else if (cVar22 == '\x01') {
            dVar46 = ((dVar45 - dVar43) - dVar125) + 1.0;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              local_358 = sqrt(dVar46);
            }
            else {
              auVar38 = vsqrtsd_avx(auVar55,auVar55);
              local_358 = auVar38._0_8_;
            }
            local_348 = local_358 * 0.5;
            local_358 = 0.5 / local_358;
            local_360 = (local_2e0 + dVar44) * local_358;
            local_338 = (dVar129 + dVar111) * local_358;
            dVar131 = dVar131 - dVar105;
          }
          else {
            dVar46 = ((dVar125 - dVar45) - dVar43) + 1.0;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              local_358 = sqrt(dVar46);
            }
            else {
              auVar38 = vsqrtsd_avx(auVar57,auVar57);
              local_358 = auVar38._0_8_;
            }
            local_338 = local_358 * 0.5;
            local_358 = 0.5 / local_358;
            local_348 = (dVar129 + dVar111) * local_358;
            local_360 = (dVar131 + dVar105) * local_358;
            dVar131 = dVar44 - local_2e0;
          }
          local_358 = dVar131 * local_358;
        }
        Q_from_AngZ((ChQuaternion<double> *)&local_1a0,-1.5707963267948966);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = local_1a0.first._M_dataplus._M_p;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_1a0.first._M_string_length;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = local_338;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = local_358;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = (double)local_1a0.first._M_string_length * local_338;
        auVar38 = vfmsub231sd_fma(auVar82,auVar123,auVar58);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = local_1a0.first.field_2._M_allocated_capacity;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = local_348;
        auVar38 = vfnmadd231sd_fma(auVar38,auVar115,auVar89);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = local_1a0.first.field_2._8_8_;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = local_360;
        auVar2 = vfnmadd231sd_fma(auVar38,auVar119,auVar96);
        auVar102._8_8_ = 0;
        auVar102._0_8_ = local_338 * (double)local_1a0.first._M_dataplus._M_p;
        auVar38 = vfmadd231sd_fma(auVar102,auVar123,auVar73);
        auVar38 = vfnmadd231sd_fma(auVar38,auVar119,auVar89);
        auVar38 = vfmadd231sd_fma(auVar38,auVar115,auVar96);
        auVar106._8_8_ = 0;
        auVar106._0_8_ = local_348 * (double)local_1a0.first._M_dataplus._M_p;
        auVar40 = vfmadd231sd_fma(auVar106,auVar123,auVar89);
        auVar40 = vfmadd231sd_fma(auVar40,auVar119,auVar73);
        auVar3 = vfnmadd231sd_fma(auVar40,auVar112,auVar96);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_360 * (double)local_1a0.first._M_dataplus._M_p;
        auVar40 = vfmadd231sd_fma(auVar59,auVar123,auVar96);
        auVar40 = vfnmadd231sd_fma(auVar40,auVar115,auVar73);
        auVar40 = vfmadd231sd_fma(auVar40,auVar112,auVar89);
        auStack_2b0._0_8_ = auVar2._0_8_;
        auStack_2b0._8_8_ = auVar38._0_8_;
        auStack_2b0._16_8_ = auVar3._0_8_;
        auStack_2b0._24_8_ = auVar40._0_8_;
        std::__cxx11::string::string
                  ((string *)&local_1a0,
                   (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_218);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,&local_1a0.first);
        std::
        vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
        ::push_back(&pmVar26->cylinders,(value_type *)local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0.first._M_dataplus._M_p != &local_1a0.first.field_2) {
          operator_delete(local_1a0.first._M_dataplus._M_p,
                          local_1a0.first.field_2._M_allocated_capacity + 1);
        }
      }
      iVar23 = (*(this_00->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(this_00)
      ;
      lVar28 = CONCAT44(extraout_var_00,iVar23);
      dVar46 = (double)local_e8._vptr_ChFrame - *(double *)(lVar28 + 8);
      dVar45 = local_e8.coord.pos.m_data[0] - *(double *)(lVar28 + 0x10);
      dVar129 = local_e8.coord.pos.m_data[1] - *(double *)(lVar28 + 0x18);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(lVar28 + 0x40);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar46;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = dVar45 * *(double *)(lVar28 + 0x58);
      auVar38 = vfmadd231sd_fma(auVar90,auVar60,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(lVar28 + 0x70);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = dVar129;
      auVar38 = vfmadd231sd_fma(auVar38,auVar83,auVar7);
      local_338 = auVar38._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(lVar28 + 0x48);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = dVar45 * *(double *)(lVar28 + 0x60);
      auVar38 = vfmadd231sd_fma(auVar91,auVar60,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(lVar28 + 0x78);
      auVar38 = vfmadd231sd_fma(auVar38,auVar83,auVar9);
      local_348 = auVar38._0_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(lVar28 + 0x50);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar46;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = dVar45 * *(double *)(lVar28 + 0x68);
      auVar38 = vfmadd231sd_fma(auVar74,auVar61,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(lVar28 + 0x80);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = dVar129;
      auVar38 = vfmadd231sd_fma(auVar38,auVar84,auVar11);
      dVar44 = auVar38._0_8_;
      ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)local_2d8,this_00);
      uVar20 = local_2c8._8_8_;
      uVar19 = local_2c8._M_allocated_capacity;
      _Var18._M_pi = _Stack_2d0._M_pi;
      dVar46 = (double)_Stack_2d0._M_pi - local_338;
      dVar45 = (double)local_2c8._M_allocated_capacity - local_348;
      dVar129 = (double)local_2c8._8_8_ - dVar44;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar45 * dVar45;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = dVar46;
      auVar38 = vfmadd231sd_fma(auVar107,auVar120,auVar120);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = dVar129;
      auVar109 = vfmadd231sd_fma(auVar38,auVar127,auVar127);
      auVar108._0_8_ = auVar109._0_8_;
      if (auVar108._0_8_ < 0.0) {
        local_2f8._0_8_ = dVar46;
        dVar43 = sqrt(auVar108._0_8_);
        auVar108._8_8_ = 0;
        auVar109 = auVar108;
      }
      else {
        auVar38 = vsqrtsd_avx(auVar109,auVar109);
        dVar43 = auVar38._0_8_;
      }
      if (1e-05 < dVar43) {
        local_2f8 = ZEXT816(0) << 0x40;
        if (((dVar46 != 0.0) || (NAN(dVar46))) || (dVar45 != 0.0)) {
LAB_0095a5ab:
          if (auVar109._0_8_ < 0.0) {
            dVar43 = sqrt(auVar109._0_8_);
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auVar108._0_8_;
          }
          else {
            auVar38 = vsqrtsd_avx(auVar109,auVar109);
            dVar43 = auVar38._0_8_;
          }
          bVar21 = 2.2250738585072014e-308 <= dVar43;
          dVar43 = 1.0 / dVar43;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = (ulong)bVar21 * (long)(dVar45 * dVar43);
          auVar133._8_8_ = 0;
          auVar133._0_8_ =
               (ulong)bVar21 * (long)(dVar46 * dVar43) + (ulong)!bVar21 * 0x3ff0000000000000;
          local_2f8._8_8_ = 0;
          local_2f8._0_8_ = (ulong)bVar21 * (long)(dVar129 * dVar43);
        }
        else {
          auVar36 = ZEXT816(0) << 0x40;
          auVar133 = ZEXT816(0x3ff0000000000000);
          if ((dVar129 != 0.0) || (NAN(dVar129))) goto LAB_0095a5ab;
        }
        auVar40 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar36,local_2f8);
        dVar46 = auVar133._0_8_ * -0.0;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = dVar46;
        auVar38 = vfmadd213sd_fma(ZEXT816(0) << 0x40,local_2f8,auVar103);
        local_248 = auVar133._0_8_ + auVar36._0_8_ * -0.0;
        local_240 = auVar38._0_8_;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = local_240 * local_240;
        auVar38 = vfmadd231sd_fma(auVar62,auVar40,auVar40);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = local_248;
        auVar38 = vfmadd231sd_fma(auVar38,auVar97,auVar97);
        local_320 = auVar40._0_8_;
        local_1d8 = auVar133;
        if (auVar38._0_8_ < 0.0) {
          local_100 = dVar46;
          dVar45 = sqrt(auVar38._0_8_);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = auVar108._0_8_;
          dVar46 = local_100;
        }
        else {
          auVar38 = vsqrtsd_avx(auVar38,auVar38);
          dVar45 = auVar38._0_8_;
        }
        dVar129 = local_2f8._0_8_;
        if (dVar45 < 0.0001) {
          auVar85._8_8_ = 0;
          auVar85._0_8_ = dVar129 * -0.0;
          auVar38 = vfmadd231sd_fma(auVar85,auVar36,ZEXT816(0) << 0x40);
          local_240 = dVar129 + dVar46;
          auVar2 = vfmsub213sd_fma(ZEXT816(0) << 0x40,local_1d8,auVar36);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = local_240 * local_240;
          auVar40 = vfmadd231sd_fma(auVar63,auVar38,auVar38);
          auVar40 = vfmadd231sd_fma(auVar40,auVar2,auVar2);
          local_320 = auVar38._0_8_;
          local_248 = auVar2._0_8_;
          if (auVar40._0_8_ < 0.0) {
            dVar45 = sqrt(auVar40._0_8_);
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auVar108._0_8_;
          }
          else {
            auVar38 = vsqrtsd_avx(auVar40,auVar40);
            dVar45 = auVar38._0_8_;
          }
        }
        auStack_2b0._8_8_ = 0.0;
        auStack_2b0._16_8_ = 0.0;
        auStack_2b0._24_8_ = 0.0;
        local_2c8._M_allocated_capacity = 0;
        local_2c8._8_8_ = 0;
        dStack_2b8 = 0.0;
        auStack_2b0._0_8_ = 0.0;
        local_2d8 = (undefined1  [8])0x3f947ae147ae147b;
        if (auVar109._0_8_ < 0.0) {
          dVar46 = sqrt(auVar109._0_8_);
          local_358 = dVar45;
        }
        else {
          auVar38 = vsqrtsd_avx(auVar109,auVar109);
          dVar46 = auVar38._0_8_;
          local_358 = auVar108._0_8_;
        }
        auVar92._8_8_ = 0;
        auVar92._0_8_ = local_240;
        auVar75._0_8_ = 1.0 / dVar45;
        auVar75._8_8_ = 0;
        local_320 = local_320 * auVar75._0_8_;
        auVar37 = vmulsd_avx512f(auVar92,auVar75);
        dVar45 = local_248 * auVar75._0_8_;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = dVar45;
        auVar38 = vmulsd_avx512f(auVar36,auVar76);
        auVar39 = vfmsub231sd_avx512f(auVar38,auVar37,local_2f8);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = local_320 * dVar129;
        auVar38 = vfmsub231sd_fma(auVar86,auVar76,local_1d8);
        auVar40 = vmulsd_avx512f(local_1d8,auVar37);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_320;
        auVar41 = vfmsub231sd_avx512f(auVar40,auVar135,auVar36);
        _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(dVar46 * 0.5);
        local_2c8._M_allocated_capacity = (size_type)((local_338 - (double)_Var18._M_pi) * 0.5);
        local_2c8._8_8_ = (local_348 - (double)uVar19) * 0.5;
        dStack_2b8 = (dVar44 - (double)uVar20) * 0.5;
        dVar43 = auVar38._0_8_;
        dVar131 = local_1d8._0_8_;
        dVar46 = dVar45 + dVar131 + dVar43;
        if (0.0 <= dVar46) {
          dVar46 = dVar46 + 1.0;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = dVar46;
          if (dVar46 < 0.0) {
            vmovsd_avx512f(auVar39);
            vmovsd_avx512f(auVar37);
            vmovsd_avx512f(auVar41);
            local_360 = sqrt(dVar46);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_358;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dVar44;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_348;
          }
          else {
            auVar38 = vsqrtsd_avx(auVar64,auVar64);
            local_360 = auVar38._0_8_;
          }
          local_358 = local_360 * 0.5;
          local_360 = 0.5 / local_360;
          auVar38 = vsubsd_avx512f(auVar41,auVar37);
          local_338 = auVar38._0_8_ * local_360;
          local_348 = (local_320 - dVar129) * local_360;
          auVar38 = vsubsd_avx512f(auVar36,auVar39);
          local_360 = auVar38._0_8_ * local_360;
        }
        else {
          cVar22 = dVar131 < dVar43;
          dVar46 = dVar131;
          if ((bool)cVar22) {
            dVar46 = dVar43;
          }
          if (dVar46 < dVar45) {
            cVar22 = '\x02';
          }
          if (cVar22 == '\x02') {
            dVar46 = ((dVar45 - dVar131) - dVar43) + 1.0;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              vmovsd_avx512f(auVar39);
              vmovsd_avx512f(auVar37);
              vmovsd_avx512f(auVar41);
              dVar46 = sqrt(dVar46);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = local_358;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar44;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = local_348;
            }
            else {
              auVar38 = vsqrtsd_avx(auVar66,auVar66);
              dVar46 = auVar38._0_8_;
            }
            local_360 = dVar46 * 0.5;
            dVar46 = 0.5 / dVar46;
            local_338 = (local_320 + dVar129) * dVar46;
            auVar38 = vaddsd_avx512f(auVar37,auVar41);
            local_348 = auVar38._0_8_ * dVar46;
            auVar38 = vsubsd_avx512f(auVar36,auVar39);
            local_320 = auVar38._0_8_;
          }
          else if (cVar22 == '\x01') {
            dVar46 = ((dVar43 - dVar45) - dVar131) + 1.0;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              vmovsd_avx512f(auVar39);
              vmovsd_avx512f(auVar37);
              vmovsd_avx512f(auVar41);
              dVar46 = sqrt(dVar46);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = local_358;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar44;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = local_348;
            }
            else {
              auVar38 = vsqrtsd_avx(auVar65,auVar65);
              dVar46 = auVar38._0_8_;
            }
            local_348 = dVar46 * 0.5;
            dVar46 = 0.5 / dVar46;
            auVar38 = vaddsd_avx512f(auVar37,auVar41);
            local_360 = auVar38._0_8_ * dVar46;
            auVar38 = vaddsd_avx512f(auVar36,auVar39);
            local_338 = auVar38._0_8_ * dVar46;
            local_320 = local_320 - dVar129;
          }
          else {
            dVar46 = ((dVar131 - dVar43) - dVar45) + 1.0;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar46;
            if (dVar46 < 0.0) {
              vmovsd_avx512f(auVar39);
              vmovsd_avx512f(auVar37);
              vmovsd_avx512f(auVar41);
              dVar46 = sqrt(dVar46);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = local_358;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar44;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = local_348;
            }
            else {
              auVar38 = vsqrtsd_avx(auVar67,auVar67);
              dVar46 = auVar38._0_8_;
            }
            local_338 = dVar46 * 0.5;
            dVar46 = 0.5 / dVar46;
            auVar38 = vaddsd_avx512f(auVar36,auVar39);
            local_348 = auVar38._0_8_ * dVar46;
            local_360 = (local_320 + dVar129) * dVar46;
            auVar38 = vsubsd_avx512f(auVar41,auVar37);
            local_320 = auVar38._0_8_;
          }
          local_358 = local_320 * dVar46;
        }
        Q_from_AngZ((ChQuaternion<double> *)&local_1a0,-1.5707963267948966);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_1a0.first._M_dataplus._M_p;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = local_1a0.first._M_string_length;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = local_338;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = local_358;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = (double)local_1a0.first._M_string_length * local_338;
        auVar38 = vfmsub231sd_fma(auVar87,auVar124,auVar68);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = local_1a0.first.field_2._M_allocated_capacity;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = local_348;
        auVar38 = vfnmadd231sd_fma(auVar38,auVar116,auVar93);
        auVar98._8_8_ = 0;
        auVar98._0_8_ = local_1a0.first.field_2._8_8_;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = local_360;
        auVar2 = vfnmadd231sd_fma(auVar38,auVar121,auVar98);
        auVar104._8_8_ = 0;
        auVar104._0_8_ = local_338 * (double)local_1a0.first._M_dataplus._M_p;
        auVar38 = vfmadd231sd_fma(auVar104,auVar124,auVar77);
        auVar38 = vfnmadd231sd_fma(auVar38,auVar121,auVar93);
        auVar38 = vfmadd231sd_fma(auVar38,auVar116,auVar98);
        auVar110._8_8_ = 0;
        auVar110._0_8_ = local_348 * (double)local_1a0.first._M_dataplus._M_p;
        auVar40 = vfmadd231sd_fma(auVar110,auVar124,auVar93);
        auVar40 = vfmadd231sd_fma(auVar40,auVar121,auVar77);
        auVar3 = vfnmadd231sd_fma(auVar40,auVar113,auVar98);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_360 * (double)local_1a0.first._M_dataplus._M_p;
        auVar40 = vfmadd231sd_fma(auVar69,auVar124,auVar98);
        auVar40 = vfnmadd231sd_fma(auVar40,auVar116,auVar77);
        auVar40 = vfmadd231sd_fma(auVar40,auVar113,auVar93);
        auStack_2b0._0_8_ = auVar2._0_8_;
        auStack_2b0._8_8_ = auVar38._0_8_;
        auStack_2b0._16_8_ = auVar3._0_8_;
        auStack_2b0._24_8_ = auVar40._0_8_;
        std::__cxx11::string::string
                  ((string *)&local_1a0,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_218);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,&local_1a0.first);
        std::
        vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
        ::push_back(&pmVar26->cylinders,(value_type *)local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0.first._M_dataplus._M_p != &local_1a0.first.field_2) {
          operator_delete(local_1a0.first._M_dataplus._M_p,
                          local_1a0.first.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->m_verbose == true) {
        pcVar14 = (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb992e0);
        }
        else {
          sVar29 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar29);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," family is ",0xb);
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
        plVar30 = (long *)std::ostream::operator<<(&std::cout,pmVar26->family);
        std::ios::widen((char)*(undefined8 *)(*plVar30 + -0x18) + (char)plVar30);
        std::ostream::put((char)plVar30);
        std::ostream::flush();
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
      }
      iVar23 = (*(pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])(pCVar24);
      bVar21 = true;
      if ((char)iVar23 != '\0') {
        std::__cxx11::string::string
                  ((string *)&local_60,
                   (pCVar24->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   &local_229);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,&local_60);
        bVar21 = pmVar26->family == this->m_family_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar21) {
        if (this->m_verbose != false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting ",8);
          pcVar14 = (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb992e0);
          }
          else {
            sVar29 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar29)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," to family ",0xb);
          plVar30 = (long *)std::ostream::operator<<(&std::cout,this->m_family_1);
          std::ios::widen((char)*(undefined8 *)(*plVar30 + -0x18) + (char)plVar30);
          std::ostream::put((char)plVar30);
          std::ostream::flush();
        }
        iVar23 = this->m_family_1;
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
        pmVar26->family = iVar23;
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
        iVar23 = this->m_family_2;
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      }
      else {
        if (this->m_verbose != false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting ",8);
          pcVar14 = (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb992e0);
          }
          else {
            sVar29 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar29)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," to family ",0xb);
          plVar30 = (long *)std::ostream::operator<<(&std::cout,this->m_family_2);
          std::ios::widen((char)*(undefined8 *)(*plVar30 + -0x18) + (char)plVar30);
          std::ostream::put((char)plVar30);
          std::ostream::flush();
        }
        iVar23 = this->m_family_2;
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
        pmVar26->family = iVar23;
        if (local_2d8 != (undefined1  [8])&local_2c8) {
          operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
        }
        iVar23 = this->m_family_1;
        std::__cxx11::string::string
                  ((string *)local_2d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1a0);
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_2d8);
      }
      pmVar26->family_mask_nocollide = iVar23;
      if (local_2d8 != (undefined1  [8])&local_2c8) {
        operator_delete((void *)local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      psVar33 = psVar33 + 1;
    } while (psVar33 != local_f0);
    fVar42 = (float)(int)local_238;
  }
  if (body_collision_info_abi_cxx11_._24_8_ != 0xb981e8) {
    p_Var31 = (_Rb_tree_node_base *)body_collision_info_abi_cxx11_._24_8_;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
      ::pair(&local_1a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
              *)(p_Var31 + 1));
      local_218 = local_1a0.second.body;
      std::
      vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
      ::vector(&local_210,&local_1a0.second.cylinders);
      iVar23 = local_1a0.second.level;
      local_1f0 = local_1a0.second.level;
      local_1f8._0_4_ = local_1a0.second.family;
      local_1f8._4_4_ = local_1a0.second.family_mask_nocollide;
      if (this->m_visType == PRIMITIVES) {
        local_228 = (ChVisualMaterial *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>>
                  (&local_220,&local_228,(allocator<chrono::ChVisualMaterial> *)local_2d8);
        local_2d8._4_4_ = 1.0 - (float)iVar23 / fVar42;
        local_2d8._0_4_ = (float)iVar23 / fVar42;
        _Stack_2d0._M_pi = _Stack_2d0._M_pi & 0xffffffff00000000;
        size._M_a = (allocator<chrono::ChVisualMaterial> *)local_2d8;
        ChVisualMaterial::SetDiffuseColor(local_228,(ChColor *)local_2d8);
        this_01 = (ChSphereShape *)
                  ChVisualShape::operator_new((ChVisualShape *)0x38,(size_t)size._M_a);
        ChSphereShape::ChSphereShape(this_01);
        local_1e8 = this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChSphereShape*>
                  (&local_1e0,this_01);
        (local_1e8->gsphere).rad = 0.1;
        local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_228;
        local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_220._M_pi;
        if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
          }
        }
        ChVisualShape::AddMaterial(&local_1e8->super_ChVisualShape,&local_110);
        if (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_110.
                     super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pCVar24 = local_218;
        local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_1e8->super_ChVisualShape;
        local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_1e0._M_pi;
        if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
          }
        }
        ChBodyAuxRef::GetFrame_COG_to_REF(&local_e8,local_218);
        local_1c0.m_data[0] = 1.0;
        local_1c0.m_data[3] = 0.0;
        local_1c0.m_data[1] = 0.0;
        local_1c0.m_data[2] = 0.0;
        local_2d8 = (undefined1  [8])&PTR__ChFrame_00b2b308;
        _Stack_2d0._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0];
        local_2c8._M_allocated_capacity = (size_type)local_e8.coord.pos.m_data[1];
        local_2c8._8_8_ = local_e8.coord.pos.m_data[2];
        dStack_2b8 = 1.0;
        auStack_2b0._16_8_ = 0.0;
        auStack_2b0._0_8_ = 0.0;
        auStack_2b0._8_8_ = 0.0;
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(auStack_2b0 + 0x18),&local_1c0);
        shape = &local_120;
        ChPhysicsItem::AddVisualShape((ChPhysicsItem *)pCVar24,shape,(ChFrame<double> *)local_2d8);
        pcVar32 = local_210.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_238 = p_Var31;
        pcVar17 = local_210.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          pcVar32 = local_210.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = local_210.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pcVar32 != pcVar17; pcVar32 = pcVar32 + 1) {
          local_e8._vptr_ChFrame = (_func_int **)pcVar32->rad;
          local_e8.coord.pos.m_data[0] = pcVar32->hlen;
          local_e8.coord.pos.m_data[1] = (pcVar32->pos).m_data[0];
          local_e8.coord.pos.m_data[2] = (pcVar32->pos).m_data[1];
          local_e8.coord.rot.m_data[0] = (pcVar32->pos).m_data[2];
          local_e8.coord.rot.m_data[1] = (pcVar32->rot).m_data[0];
          local_e8.coord.rot.m_data[2] = (pcVar32->rot).m_data[1];
          local_e8.coord.rot.m_data[3] = (pcVar32->rot).m_data[2];
          local_e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (pcVar32->rot).m_data[3];
          this_02 = (ChCylinderShape *)
                    ChVisualShape::operator_new((ChVisualShape *)0x68,(size_t)shape);
          ChCylinderShape::ChCylinderShape(this_02);
          local_1c0.m_data[0] = (double)this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCylinderShape*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0.m_data + 1),this_02);
          ((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->rad = (double)local_e8._vptr_ChFrame;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = local_e8.coord.pos.m_data[0];
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p1).m_data[0] = 0.0;
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p1).m_data[1] =
               local_e8.coord.pos.m_data[0];
          auVar16._8_8_ = 0x8000000000000000;
          auVar16._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar70,auVar16);
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p1).m_data[2] = 0.0;
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p2).m_data[0] = 0.0;
          dVar46 = (double)vmovlpd_avx(auVar38);
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p2).m_data[1] = dVar46;
          (((ChCylinder *)((long)local_1c0.m_data[0] + 0x28))->p2).m_data[2] = 0.0;
          local_130.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = local_228;
          local_130.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_220._M_pi;
          if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
            }
          }
          ChVisualShape::AddMaterial((ChVisualShape *)local_1c0.m_data[0],&local_130);
          if (local_130.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_130.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pCVar24 = local_218;
          local_140.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_1c0.m_data[0];
          local_140.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.m_data[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_1c0.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_1c0.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_1c0.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_1c0.m_data[1] + 8) + 1;
            }
          }
          local_2d8 = (undefined1  [8])&PTR__ChFrame_00b2b308;
          _Stack_2d0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[1];
          local_2c8._M_allocated_capacity = (size_type)local_e8.coord.pos.m_data[2];
          local_2c8._8_8_ = local_e8.coord.rot.m_data[0];
          dStack_2b8 = local_e8.coord.rot.m_data[1];
          auStack_2b0._0_8_ = local_e8.coord.rot.m_data[2];
          auStack_2b0._8_8_ = local_e8.coord.rot.m_data[3];
          auStack_2b0._16_8_ =
               local_e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          ChMatrix33<double>::ChMatrix33
                    ((ChMatrix33<double> *)(auStack_2b0 + 0x18),
                     (ChQuaternion<double> *)(local_e8.coord.rot.m_data + 1));
          shape = &local_140;
          ChPhysicsItem::AddVisualShape((ChPhysicsItem *)pCVar24,shape,(ChFrame<double> *)local_2d8)
          ;
          if (local_140.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_140.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0.m_data[1]);
          }
        }
        if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
        }
        p_Var31 = local_238;
        if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
        }
      }
      local_e8._vptr_ChFrame = (_func_int **)0x0;
      local_e8.coord.pos.m_data[0] = 0.0;
      iVar23 = (*(local_f8->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                         ();
      if (iVar23 == 0) {
        local_2d8 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
                  (&_Stack_2d0,(ChMaterialSurfaceNSC **)local_2d8,
                   (allocator<chrono::ChMaterialSurfaceNSC> *)&local_1c0);
        ChMaterialSurface::SetFriction((ChMaterialSurface *)local_2d8,this->m_friction);
        *(float *)((long)local_2d8 + 0x18) = this->m_restitution;
LAB_0095b74f:
        local_e8._vptr_ChFrame = (_func_int **)local_2d8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.coord,&_Stack_2d0);
        if (_Stack_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2d0._M_pi);
        }
      }
      else if (iVar23 == 1) {
        local_2d8 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
                  (&_Stack_2d0,(ChMaterialSurfaceSMC **)local_2d8,
                   (allocator<chrono::ChMaterialSurfaceSMC> *)&local_1c0);
        ChMaterialSurface::SetFriction((ChMaterialSurface *)local_2d8,this->m_friction);
        *(float *)((long)local_2d8 + 0x18) = this->m_restitution;
        *(float *)((long)local_2d8 + 0x1c) = this->m_young_modulus;
        *(float *)((long)local_2d8 + 0x20) = this->m_poisson_ratio;
        *(float *)((long)local_2d8 + 0x30) = this->m_kn;
        *(float *)((long)local_2d8 + 0x38) = this->m_gn;
        *(float *)((long)local_2d8 + 0x34) = this->m_kt;
        *(float *)((long)local_2d8 + 0x3c) = this->m_gt;
        goto LAB_0095b74f;
      }
      iVar23 = (*(local_218->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])();
      if ((char)iVar23 != '\0') {
        peVar15 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        p_Var13 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          }
        }
        (*peVar15->_vptr_ChCollisionModel[3])();
        pcVar32 = local_210.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_238 = p_Var31;
        pcVar17 = local_210.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          pcVar32 = local_210.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = local_210.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pCVar24 = local_218, p_Var31 = local_238, pcVar32 != pcVar17; pcVar32 = pcVar32 + 1)
        {
          radius = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar32->rad;
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar32->hlen;
          local_2c8._M_allocated_capacity = (size_type)(pcVar32->pos).m_data[0];
          local_2c8._8_8_ = (pcVar32->pos).m_data[1];
          dStack_2b8 = (pcVar32->pos).m_data[2];
          auStack_2b0._0_8_ = (pcVar32->rot).m_data[0];
          auStack_2b0._8_8_ = (pcVar32->rot).m_data[1];
          auStack_2b0._16_8_ = (pcVar32->rot).m_data[2];
          auStack_2b0._24_8_ = (pcVar32->rot).m_data[3];
          local_150.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)local_e8._vptr_ChFrame;
          local_150.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_e8.coord.pos.m_data[0] + 8) =
                   *(_Atomic_word *)((long)local_e8.coord.pos.m_data[0] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_e8.coord.pos.m_data[0] + 8) =
                   *(_Atomic_word *)((long)local_e8.coord.pos.m_data[0] + 8) + 1;
            }
          }
          local_2d8 = (undefined1  [8])radius;
          _Stack_2d0._M_pi = p_Var13;
          ChVisualMaterial::Default();
          AddCylinderGeometry(&pCVar24->super_ChBody,&local_150,(double)radius,(double)p_Var13,
                              (ChVector<double> *)&local_2c8,(ChQuaternion<double> *)auStack_2b0,
                              false,&local_40);
          if (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_150.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_150.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        peVar15 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        p_Var13 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          }
        }
        (*peVar15->_vptr_ChCollisionModel[0x19])(peVar15,local_1f8 & 0xffffffff);
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
        }
        peVar15 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        p_Var13 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          }
        }
        (*peVar15->_vptr_ChCollisionModel[0x1b])(peVar15,local_1f8 >> 0x20);
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
        }
        peVar15 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        p_Var13 = (local_218->super_ChBody).collision_model.
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          }
        }
        (*peVar15->_vptr_ChCollisionModel[4])();
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0]);
      }
      if (local_210.
          super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.
                        super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_210.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a0.second.cylinders.
          super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.second.cylinders.
                        super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a0.second.cylinders.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.second.cylinders.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.first._M_dataplus._M_p != &local_1a0.first.field_2) {
        operator_delete(local_1a0.first._M_dataplus._M_p,
                        local_1a0.first.field_2._M_allocated_capacity + 1);
      }
      p_Var31 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var31);
    } while (p_Var31 != (_Rb_tree_node_base *)(body_collision_info_abi_cxx11_ + 8));
  }
  return;
}

Assistant:

void ChParserOpenSim::initShapes(rapidxml::xml_node<>* node, ChSystem& system) {
    if (m_verbose)
        std::cout << "Creating collision and visualization shapes " << std::endl;

    // Keep the maximum depth so that we can color appropriately
    int max_depth_level = 0;

    // Go through the motions of constructing collision models, but don't do it until we have all of the necessary info
    for (auto link : m_jointList) {
        auto linkCoords = link->GetLinkAbsoluteCoords();
        // These need to be ChBodyAuxRef, but hopefully that's all that we'll have
        auto parent = dynamic_cast<ChBodyAuxRef*>(link->GetBody1());
        auto child = dynamic_cast<ChBodyAuxRef*>(link->GetBody2());

        // Add pointers to struct if they don't exist, struct entry should be default-constructed
        if (body_collision_info.find(parent->GetName()) == body_collision_info.end()) {
            body_collision_info[parent->GetName()].body = parent;
        }
        if (body_collision_info.find(child->GetName()) == body_collision_info.end()) {
            body_collision_info[child->GetName()].body = child;
        }
        body_collision_struct& parent_col_info = body_collision_info[parent->GetName()];
        body_collision_struct& child_col_info = body_collision_info[child->GetName()];

        // If a body is fixed, treat it as level 0
        if (parent->GetBodyFixed()) {
            parent_col_info.level = 0;
        }
        // Child is one more level than parent
        int child_level = parent_col_info.level + 1;
        // Keep a max depth so we know how to color it
        if (child_level > max_depth_level) {
            max_depth_level = child_level;
        }
        child_col_info.level = child_level;

        ChVector<> p1, p2;
        // Make cylinder from parent to outbound joint
        // First end is at parent COM
        p1 = parent->GetFrame_COG_to_REF().GetPos();
        // Second end is at joint location
        p2 = parent->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p1 - p2);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p1 - p2).Length() / 2;
            new_cyl.pos = (p2 - p1) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[parent->GetName()].cylinders.push_back(new_cyl);
        }

        // First end is at joint location
        p1 = child->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);
        // Second end is at child COM
        p2 = child->GetFrame_COG_to_REF().GetPos();

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p2 - p1);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p2 - p1).Length() / 2;
            new_cyl.pos = (p1 - p2) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[child->GetName()].cylinders.push_back(new_cyl);
        }

        // Make cylinder from child to inbound joint
        if (m_verbose)
            std::cout << parent->GetName() << " family is " << body_collision_info[parent->GetName()].family
                      << std::endl;

        if ((parent->GetCollide() == false) || (body_collision_info[parent->GetName()].family == m_family_2)) {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_1 << std::endl;
            body_collision_info[child->GetName()].family = m_family_1;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_2;
        } else {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_2 << std::endl;
            body_collision_info[child->GetName()].family = m_family_2;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_1;
        }
    }

    // Loop through the list of bodies in the model and create visualization and collision shapes
    for (auto body_info_pair : body_collision_info) {
        auto body_info = body_info_pair.second;

        // Create primitive visualization assets
        if (m_visType == VisType::PRIMITIVES) {
            // Assign a color based on the body's level in the tree hierarchy
            float colorVal = (1.0f * body_info.level) / max_depth_level;
            auto vis_mat = chrono_types::make_shared<ChVisualMaterial>();
            vis_mat->SetDiffuseColor(ChColor(colorVal, 1.0f - colorVal, 0.0f));

            // Create a sphere at the body COM
            auto sphere = chrono_types::make_shared<ChSphereShape>();
            sphere->GetSphereGeometry().rad = 0.1;
            sphere->AddMaterial(vis_mat);
            body_info.body->AddVisualShape(sphere, ChFrame<>(body_info.body->GetFrame_COG_to_REF().GetPos()));

            // Create visualization cylinders
            for (auto cyl_info : body_info.cylinders) {
                auto cylinder = chrono_types::make_shared<ChCylinderShape>();
                cylinder->GetCylinderGeometry().rad = cyl_info.rad;
                cylinder->GetCylinderGeometry().p1 = ChVector<>(0, cyl_info.hlen, 0);
                cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -cyl_info.hlen, 0);
                cylinder->AddMaterial(vis_mat);
                body_info.body->AddVisualShape(cylinder, ChFrame<>(cyl_info.pos, cyl_info.rot));
            }
        }

        // Create a contact material that will be shared by all shapes for this body
        std::shared_ptr<ChMaterialSurface> mat;
        switch (system.GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                matNSC->SetFriction(m_friction);
                matNSC->SetRestitution(m_restitution);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                matSMC->SetFriction(m_friction);
                matSMC->SetRestitution(m_restitution);
                matSMC->SetYoungModulus(m_young_modulus);
                matSMC->SetPoissonRatio(m_poisson_ratio);
                matSMC->SetKn(m_kn);
                matSMC->SetGn(m_gn);
                matSMC->SetKt(m_kt);
                matSMC->SetGt(m_gt);
                mat = matSMC;
                break;
            }
        }

        // Set collision shapes
        if (body_info.body->GetCollide()) {
            body_info.body->GetCollisionModel()->ClearModel();

            for (auto cyl_info : body_info.cylinders) {
                utils::AddCylinderGeometry(body_info.body, mat, cyl_info.rad, cyl_info.hlen, cyl_info.pos, cyl_info.rot,
                                           false);
            }

            body_info.body->GetCollisionModel()->SetFamily(body_info.family);
            body_info.body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(body_info.family_mask_nocollide);

            body_info.body->GetCollisionModel()->BuildModel();
        }
    }
}